

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
Nfa::dfs_del_loop(Nfa *this,int now,int *_index,
                 stack<int,_std::deque<int,_std::allocator<int>_>_> *stk,
                 vector<int,_std::allocator<int>_> *dfn,vector<int,_std::allocator<int>_> *low,
                 vector<int,_std::allocator<int>_> *belong)

{
  ulong *puVar1;
  Fa_Node *pFVar2;
  pointer piVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  pointer ppFVar7;
  _Elt_pointer piVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  pointer pEVar12;
  bool bVar13;
  int iVar14;
  pointer pEVar15;
  int local_4c;
  pointer local_48;
  int *local_40;
  ulong local_38;
  
  iVar5 = *_index;
  uVar9 = (ulong)now;
  (dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar9] = iVar5;
  (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar9] = iVar5;
  *_index = *_index + 1;
  piVar8 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  local_4c = now;
  local_40 = _index;
  if (piVar8 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                ._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)stk,&local_4c);
    uVar9 = (ulong)local_4c;
  }
  else {
    *piVar8 = now;
    (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_cur = piVar8 + 1;
  }
  iVar5 = local_4c + 0x3f;
  if (-1 < local_4c) {
    iVar5 = local_4c;
  }
  puVar1 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           (long)(iVar5 >> 6) +
           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)uVar9 & 0x3f);
  ppFVar7 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar15 = (ppFVar7[uVar9]->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar12 = *(pointer *)
             ((long)&(ppFVar7[uVar9]->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
             + 8);
  if (pEVar15 != pEVar12) {
    local_38 = 0x800000000000003f;
    local_48 = pEVar12;
    do {
      if (pEVar15->c == '\0') {
        pFVar2 = pEVar15->v;
        lVar10 = (long)local_4c;
        iVar5 = pFVar2->n;
        uVar9 = (ulong)iVar5;
        if (ppFVar7[lVar10]->start == true) {
          ppFVar7[uVar9]->start = true;
        }
        iVar6 = (dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start[uVar9];
        if (iVar6 == 0) {
          dfs_del_loop(this,iVar5,local_40,stk,dfn,low,belong);
          piVar3 = (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = piVar3[local_4c];
          if (piVar3[pFVar2->n] < piVar3[local_4c]) {
            iVar5 = piVar3[pFVar2->n];
          }
          piVar3[local_4c] = iVar5;
          ppFVar7 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pEVar12 = local_48;
        }
        else {
          iVar14 = iVar5 + 0x3f;
          if (-1 < iVar5) {
            iVar14 = iVar5;
          }
          if (((this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar14 >> 6) +
                (ulong)((uVar9 & local_38) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar9 & 0x3f) & 1) != 0) {
            piVar3 = (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5 = piVar3[lVar10];
            if (iVar6 < iVar5) {
              iVar5 = iVar6;
            }
            piVar3[lVar10] = iVar5;
          }
        }
        if (ppFVar7[pFVar2->n]->end == true) {
          ppFVar7[local_4c]->end = true;
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar12);
    uVar9 = (ulong)local_4c;
  }
  if ((dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      [uVar9] ==
      (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      [uVar9]) {
    do {
      piVar8 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_cur;
      if (piVar8 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        return;
      }
      if (piVar8 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        piVar8 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      iVar5 = piVar8[-1];
      uVar9 = (ulong)iVar5;
      std::deque<int,_std::allocator<int>_>::pop_back(&stk->c);
      iVar6 = iVar5 + 0x3f;
      if (-1 < (long)uVar9) {
        iVar6 = iVar5;
      }
      bVar4 = (byte)iVar5 & 0x3f;
      puVar1 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               (long)(iVar6 >> 6) +
               (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      (belong->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = local_4c;
      ppFVar7 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar2 = ppFVar7[local_4c];
      bVar11 = true;
      bVar13 = true;
      if (pFVar2->start == false) {
        bVar13 = ppFVar7[uVar9]->start;
      }
      pFVar2->start = bVar13;
      if (pFVar2->end == false) {
        bVar11 = ppFVar7[uVar9]->end;
      }
      pFVar2->end = bVar11;
    } while (iVar5 != local_4c);
  }
  return;
}

Assistant:

void
Nfa::dfs_del_loop(int now, int &_index, stack<int> &stk, vector<int> &dfn, vector<int> &low,
                  vector<int> &belong) {
    low[now] = dfn[now] = _index;
    _index++;
    stk.push(now);
    used[now] = true;
    for (auto i:Node[now]->edge) {
        if (i.c != '\0') {
            continue;
        }
        if (Node[now]->start) {
            Node[i.v->n]->start = true;
        }
        //start expand
        if (!dfn[i.v->n]) {
            dfs_del_loop(i.v->n, _index, stk, dfn, low, belong);
            low[now] = min(low[now], low[i.v->n]);
        } else if (used[i.v->n]) {
            low[now] = min(low[now], dfn[i.v->n]);
        }
        if (Node[i.v->n]->end) {
            Node[now]->end = true;
        }
        //end expand
    }
    if (dfn[now] == low[now]) {
        while (!stk.empty()) {
            int u = stk.top();
            stk.pop();
            used[u] = false;
            belong[u] = now;

            Node[now]->start = Node[now]->start || Node[u]->start;
            Node[now]->end = Node[now]->end || Node[u]->end;

            if (u == now) {
                break;
            }
        }
    }
}